

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

HivePartitioningIndex *
duckdb::HivePartitioningIndex::Deserialize
          (HivePartitioningIndex *__return_storage_ptr__,Deserializer *deserializer)

{
  int iVar1;
  uint uVar2;
  idx_t index;
  _func_int **pp_Var3;
  type ret;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  string local_48;
  undefined4 extraout_var;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"value");
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_68 = &local_58;
    local_58._M_local_buf[0] = '\0';
    local_60 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_68,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"index");
  pp_Var3 = deserializer->_vptr_Deserializer;
  if ((char)uVar2 == '\0') {
    index = 0;
  }
  else {
    iVar1 = (*pp_Var3[0x15])(deserializer);
    index = CONCAT44(extraout_var,iVar1);
    pp_Var3 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var3[5])(deserializer,(ulong)(uVar2 & 0xff));
  if (local_68 == &local_58) {
    local_48.field_2._8_8_ = local_58._8_8_;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)local_68;
  }
  local_48.field_2._M_allocated_capacity._1_7_ = local_58._M_allocated_capacity._1_7_;
  local_48.field_2._M_local_buf[0] = local_58._M_local_buf[0];
  local_48._M_string_length = local_60;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_68 = &local_58;
  HivePartitioningIndex(__return_storage_ptr__,&local_48,index);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

HivePartitioningIndex HivePartitioningIndex::Deserialize(Deserializer &deserializer) {
	auto value = deserializer.ReadPropertyWithDefault<string>(100, "value");
	auto index = deserializer.ReadPropertyWithDefault<idx_t>(101, "index");
	HivePartitioningIndex result(std::move(value), index);
	return result;
}